

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall
google::protobuf::ServiceDescriptorProto::SerializeWithCachedSizes
          (ServiceDescriptorProto *this,CodedOutputStream *output)

{
  uint uVar1;
  int iVar2;
  string *psVar3;
  void *pvVar4;
  Type *value;
  int index;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 1) != 0) {
    psVar3 = (this->name_).ptr_;
    internal::WireFormatLite::VerifyUtf8String
              ((psVar3->_M_dataplus)._M_p,(int)psVar3->_M_string_length,SERIALIZE,
               "google.protobuf.ServiceDescriptorProto.name");
    internal::WireFormatLite::WriteStringMaybeAliased(1,(this->name_).ptr_,output);
  }
  iVar2 = (this->method_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar2 != 0) {
    index = 0;
    do {
      value = internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<google::protobuf::MethodDescriptorProto>::TypeHandler>
                        (&(this->method_).super_RepeatedPtrFieldBase,index);
      internal::WireFormatLite::WriteMessageMaybeToArray(2,(MessageLite *)value,output);
      index = index + 1;
    } while (iVar2 != index);
  }
  if ((uVar1 & 2) != 0) {
    internal::WireFormatLite::WriteMessageMaybeToArray(3,(MessageLite *)this->options_,output);
  }
  pvVar4 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar4 & 1) == 0) {
    return;
  }
  internal::WireFormat::SerializeUnknownFields
            ((UnknownFieldSet *)((ulong)pvVar4 & 0xfffffffffffffffe),output);
  return;
}

Assistant:

void ServiceDescriptorProto::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:google.protobuf.ServiceDescriptorProto)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string name = 1;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->name().data(), this->name().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.ServiceDescriptorProto.name");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      1, this->name(), output);
  }

  // repeated .google.protobuf.MethodDescriptorProto method = 2;
  for (unsigned int i = 0, n = this->method_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      2, this->method(i), output);
  }

  // optional .google.protobuf.ServiceOptions options = 3;
  if (cached_has_bits & 0x00000002u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      3, *this->options_, output);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    ::google::protobuf::internal::WireFormat::SerializeUnknownFields(
        unknown_fields(), output);
  }
  // @@protoc_insertion_point(serialize_end:google.protobuf.ServiceDescriptorProto)
}